

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector3.cpp
# Opt level: O0

Vector3 * __thiscall Vector3::refracted(Vector3 *this,Vector3 *N,double n,bool *isRefracted)

{
  int iVar1;
  uchar *in_RCX;
  Vector3 *in_RDX;
  size_t *siglen;
  size_t *siglen_00;
  EVP_PKEY_CTX *in_RSI;
  EVP_PKEY_CTX *sig;
  Vector3 *in_RDI;
  size_t in_R8;
  double in_XMM0_Qa;
  double dVar2;
  double dVar3;
  double cos2;
  double sin22;
  double cos1;
  Vector3 V;
  Vector3 *in_stack_ffffffffffffff18;
  Vector3 *A;
  Vector3 local_c8;
  Vector3 local_b0;
  Vector3 local_98;
  Vector3 *in_stack_ffffffffffffff90;
  Vector3 *in_stack_ffffffffffffff98;
  Vector3 local_40;
  uchar *local_28;
  double local_20;
  Vector3 *local_18;
  
  sig = in_RSI;
  A = in_RDI;
  local_28 = in_RCX;
  local_20 = in_XMM0_Qa;
  local_18 = in_RDX;
  len((Vector3 *)0x11ba47);
  iVar1 = sign((EVP_PKEY_CTX *)in_RDX,(uchar *)sig,siglen,in_RCX,in_R8);
  if (iVar1 != 0) {
    __assert_fail("!sign(N.len() - 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/lazycal[P]Progressive-Photon-Mapping/Vector3.cpp"
                  ,0x93,"Vector3 Vector3::refracted(const Vector3 &, double, bool &) const");
  }
  len((Vector3 *)0x11ba99);
  iVar1 = sign(in_RSI,(uchar *)sig,siglen_00,in_RCX,in_R8);
  if (iVar1 != 0) {
    __assert_fail("!sign(len() - 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/lazycal[P]Progressive-Photon-Mapping/Vector3.cpp"
                  ,0x94,"Vector3 Vector3::refracted(const Vector3 &, double, bool &) const");
  }
  operator-(in_stack_ffffffffffffff18);
  dVar2 = dot(local_18,&local_40);
  dVar3 = ((-dVar2 * dVar2 + 1.0) / local_20) / local_20;
  *local_28 = '\0';
  if (dVar3 <= 1.0) {
    dVar3 = sqrt(1.0 - dVar3);
    *local_28 = '\x01';
    operator-(in_stack_ffffffffffffff18);
    operator/(A,&in_RDI->x);
    Vector3(&local_c8,dVar3 - dVar2 / local_20);
    ::operator*(A,in_RDI);
    operator-(A,in_RDI);
    ~Vector3(&local_b0);
    ~Vector3(&local_c8);
    ~Vector3((Vector3 *)&stack0xffffffffffffff80);
    ~Vector3(&local_98);
  }
  else {
    reflected(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  }
  ~Vector3(&local_40);
  return A;
}

Assistant:

Vector3 Vector3::refracted(const Vector3 &N, double n, bool &isRefracted) const{
#ifdef DEBUG
    assert(!sign(N.len() - 1));
    assert(!sign(len() - 1));
#endif
    Vector3 V = -*this;
    double cos1 = N.dot(V), sin22 = (1 - cos1 * cos1)/n/n;
    isRefracted = 0;
    if (sin22 > 1) return reflected(N);
    double cos2 = sqrt(1 - sin22);
    isRefracted = 1;
    return -V/n - (cos2 - cos1/n) * N;
}